

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAbstractTableElement.cpp
# Opt level: O2

void __thiscall KDReports::AbstractTableElement::AbstractTableElement(AbstractTableElement *this)

{
  AbstractTableElementPrivate *this_00;
  
  Element::Element(&this->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__AbstractTableElement_001702e0;
  this_00 = (AbstractTableElementPrivate *)operator_new(0x58);
  AbstractTableElementPrivate::AbstractTableElementPrivate(this_00);
  (this->d)._M_t.
  super___uniq_ptr_impl<KDReports::AbstractTableElementPrivate,_std::default_delete<KDReports::AbstractTableElementPrivate>_>
  ._M_t.
  super__Tuple_impl<0UL,_KDReports::AbstractTableElementPrivate_*,_std::default_delete<KDReports::AbstractTableElementPrivate>_>
  .super__Head_base<0UL,_KDReports::AbstractTableElementPrivate_*,_false>._M_head_impl = this_00;
  return;
}

Assistant:

KDReports::AbstractTableElement::AbstractTableElement()
    : Element()
    , d(new AbstractTableElementPrivate)
{
}